

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O0

REF_STATUS ref_sort_shuffle(REF_INT n,REF_INT *permutation)

{
  REF_INT RVar1;
  int iVar2;
  int local_34;
  int local_30;
  int local_2c;
  REF_INT temp;
  REF_INT j;
  REF_INT i;
  REF_INT *permutation_local;
  REF_INT n_local;
  
  for (temp = 0; temp < n; temp = temp + 1) {
    permutation[temp] = temp;
  }
  for (temp = 0; temp < n + -1; temp = temp + 1) {
    iVar2 = rand();
    local_34 = iVar2 % (n - temp) + temp;
    local_2c = local_34;
    if (n + -1 <= local_34) {
      local_2c = n + -1;
    }
    if (local_2c < temp) {
      local_30 = temp;
    }
    else {
      if (n + -1 <= local_34) {
        local_34 = n + -1;
      }
      local_30 = local_34;
    }
    RVar1 = permutation[local_30];
    permutation[local_30] = permutation[temp];
    permutation[temp] = RVar1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_sort_shuffle(REF_INT n, REF_INT *permutation) {
  REF_INT i, j, temp;
  for (i = 0; i < n; i++) permutation[i] = i;
  for (i = 0; i < n - 1; i++) {
    j = rand() % (n - 1 - i + 1) + i; /* i <= j < n */
    j = MAX(i, MIN(j, n - 1));        /* not needed, but don't trust myself */
    temp = permutation[j];
    permutation[j] = permutation[i];
    permutation[i] = temp;
  }
  return REF_SUCCESS;
}